

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_rotate_right_uint64_192(mzd_local_t *res,mzd_local_t *val,uint count)

{
  word wVar1;
  byte bVar2;
  byte bVar3;
  word tmp;
  block_t *rblock;
  block_t *block;
  uint left_count;
  uint count_local;
  mzd_local_t *val_local;
  mzd_local_t *res_local;
  
  bVar2 = (byte)count;
  bVar3 = 0x40 - bVar2;
  wVar1 = val->w64[0];
  res->w64[0] = val->w64[0] >> (bVar2 & 0x3f) | val->w64[1] << (bVar3 & 0x3f);
  res->w64[1] = val->w64[1] >> (bVar2 & 0x3f) | val->w64[2] << (bVar3 & 0x3f);
  res->w64[2] = val->w64[2] >> (bVar2 & 0x3f) | wVar1 << (bVar3 & 0x3f);
  return;
}

Assistant:

void mzd_rotate_right_uint64_192(mzd_local_t* res, const mzd_local_t* val, unsigned int count) {
  const unsigned int left_count = 8 * sizeof(word) - count;
  const block_t* block          = CONST_BLOCK(val, 0);
  block_t* rblock               = BLOCK(res, 0);

  const word tmp = block->w64[0] << left_count;
  rblock->w64[0] = (block->w64[0] >> count) | (block->w64[1] << left_count);
  rblock->w64[1] = (block->w64[1] >> count) | (block->w64[2] << left_count);
  rblock->w64[2] = (block->w64[2] >> count) | tmp;
}